

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_huffman_code_lengths(uint *lengths,uint *frequencies,size_t numcodes,uint maxbitlen)

{
  BPMNode **__ptr;
  uint uVar1;
  int iVar2;
  BPMNode *leaves;
  BPMNode *pBVar3;
  BPMNode **ppBVar4;
  BPMNode **__ptr_00;
  ulong uVar5;
  ulong uVar6;
  size_t __nmemb;
  undefined1 auVar7 [16];
  BPMLists lists;
  
  if ((ulong)(uint)(1 << ((byte)maxbitlen & 0x1f)) <= numcodes - 1) {
    return 0x50;
  }
  leaves = (BPMNode *)malloc(numcodes * 0x18);
  if (leaves == (BPMNode *)0x0) {
    return 0x53;
  }
  __nmemb = 0;
  for (uVar1 = 0; uVar1 != numcodes; uVar1 = uVar1 + 1) {
    if (frequencies[uVar1] != 0) {
      leaves[__nmemb].weight = frequencies[uVar1];
      leaves[__nmemb].index = uVar1;
      __nmemb = __nmemb + 1;
    }
  }
  for (uVar1 = 0; uVar1 != numcodes; uVar1 = uVar1 + 1) {
    lengths[uVar1] = 0;
  }
  if (__nmemb == 1) {
    uVar1 = leaves->index;
    lengths[uVar1] = 1;
    lengths[(ulong)uVar1 == 0] = 1;
  }
  else {
    if (__nmemb != 0) {
      qsort(leaves,__nmemb,0x18,bpmnode_compare);
      lists.memsize = (maxbitlen + 1) * maxbitlen * 2;
      uVar6 = (ulong)lists.memsize;
      lists.nextfree = 0;
      lists.numfree = lists.memsize;
      lists.listsize = maxbitlen;
      pBVar3 = (BPMNode *)malloc(uVar6 * 0x18);
      lists.memory = pBVar3;
      ppBVar4 = (BPMNode **)malloc(uVar6 * 8);
      lists.freelist = ppBVar4;
      __ptr_00 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      lists.chains0 = __ptr_00;
      lists.chains1 = (BPMNode **)malloc((ulong)maxbitlen << 3);
      auVar7._0_4_ = -(uint)((int)((ulong)pBVar3 >> 0x20) == 0 && (int)pBVar3 == 0);
      auVar7._4_4_ = -(uint)((int)ppBVar4 == 0 && (int)((ulong)ppBVar4 >> 0x20) == 0);
      auVar7._8_4_ = -(uint)((int)((ulong)__ptr_00 >> 0x20) == 0 && (int)__ptr_00 == 0);
      auVar7._12_4_ = -(uint)((int)lists.chains1 == 0 && (int)((ulong)lists.chains1 >> 0x20) == 0);
      iVar2 = movmskps((int)lists.chains1,auVar7);
      uVar1 = 0x53;
      if (iVar2 == 0) {
        for (uVar5 = 0; uVar6 != uVar5; uVar5 = uVar5 + 1) {
          ppBVar4[uVar5] = pBVar3;
          pBVar3 = pBVar3 + 1;
        }
        bpmnode_create(&lists,leaves->weight,1,(BPMNode *)0x0);
        uVar6 = 2;
        bpmnode_create(&lists,leaves[1].weight,2,(BPMNode *)0x0);
        for (uVar5 = 0; lists.listsize != uVar5; uVar5 = uVar5 + 1) {
          lists.chains0[uVar5] = lists.memory;
          lists.chains1[uVar5] = lists.memory + 1;
        }
        for (; __nmemb * 2 - 2 != uVar6; uVar6 = (ulong)((int)uVar6 + 1)) {
          boundaryPM(&lists,leaves,__nmemb,maxbitlen - 1,(int)uVar6);
        }
        ppBVar4 = lists.chains1 + (maxbitlen - 1);
        while (pBVar3 = *ppBVar4, pBVar3 != (BPMNode *)0x0) {
          for (uVar6 = 0; (uint)uVar6 != pBVar3->index; uVar6 = (ulong)((uint)uVar6 + 1)) {
            lengths[leaves[uVar6].index] = lengths[leaves[uVar6].index] + 1;
          }
          ppBVar4 = &pBVar3->tail;
        }
        uVar1 = 0;
        ppBVar4 = lists.freelist;
        pBVar3 = lists.memory;
        __ptr_00 = lists.chains0;
      }
      __ptr = lists.chains1;
      free(pBVar3);
      free(ppBVar4);
      free(__ptr_00);
      free(__ptr);
      goto LAB_0018422a;
    }
    lengths[0] = 1;
    lengths[1] = 1;
  }
  uVar1 = 0;
LAB_0018422a:
  free(leaves);
  return uVar1;
}

Assistant:

unsigned lodepng_huffman_code_lengths(unsigned* lengths, const unsigned* frequencies,
                                      size_t numcodes, unsigned maxbitlen)
{
  unsigned error = 0;
  unsigned i;
  size_t numpresent = 0; /*number of symbols with non-zero frequency*/
  BPMNode* leaves; /*the symbols, only those with > 0 frequency*/

  if(numcodes == 0) return 80; /*error: a tree of 0 symbols is not supposed to be made*/
  if((1u << maxbitlen) < numcodes) return 80; /*error: represent all symbols*/

  leaves = (BPMNode*)lodepng_malloc(numcodes * sizeof(*leaves));
  if(!leaves) return 83; /*alloc fail*/

  for(i = 0; i != numcodes; ++i)
  {
    if(frequencies[i] > 0)
    {
      leaves[numpresent].weight = frequencies[i];
      leaves[numpresent].index = i;
      ++numpresent;
    }
  }

  for(i = 0; i != numcodes; ++i) lengths[i] = 0;

  /*ensure at least two present symbols. There should be at least one symbol
  according to RFC 1951 section 3.2.7. Some decoders incorrectly require two. To
  make these work as well ensure there are at least two symbols. The
  Package-Merge code below also doesn't work correctly if there's only one
  symbol, it'd give it the theoritical 0 bits but in practice zlib wants 1 bit*/
  if(numpresent == 0)
  {
    lengths[0] = lengths[1] = 1; /*note that for RFC 1951 section 3.2.7, only lengths[0] = 1 is needed*/
  }
  else if(numpresent == 1)
  {
    lengths[leaves[0].index] = 1;
    lengths[leaves[0].index == 0 ? 1 : 0] = 1;
  }
  else
  {
    BPMLists lists;
    BPMNode* node;

    qsort(leaves, numpresent, sizeof(BPMNode), bpmnode_compare);

    lists.listsize = maxbitlen;
    lists.memsize = 2 * maxbitlen * (maxbitlen + 1);
    lists.nextfree = 0;
    lists.numfree = lists.memsize;
    lists.memory = (BPMNode*)lodepng_malloc(lists.memsize * sizeof(*lists.memory));
    lists.freelist = (BPMNode**)lodepng_malloc(lists.memsize * sizeof(BPMNode*));
    lists.chains0 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    lists.chains1 = (BPMNode**)lodepng_malloc(lists.listsize * sizeof(BPMNode*));
    if(!lists.memory || !lists.freelist || !lists.chains0 || !lists.chains1) error = 83; /*alloc fail*/

    if(!error)
    {
      for(i = 0; i != lists.memsize; ++i) lists.freelist[i] = &lists.memory[i];

      bpmnode_create(&lists, leaves[0].weight, 1, 0);
      bpmnode_create(&lists, leaves[1].weight, 2, 0);

      for(i = 0; i != lists.listsize; ++i)
      {
        lists.chains0[i] = &lists.memory[0];
        lists.chains1[i] = &lists.memory[1];
      }

      /*each boundaryPM call adds one chain to the last list, and we need 2 * numpresent - 2 chains.*/
      for(i = 2; i != 2 * numpresent - 2; ++i) boundaryPM(&lists, leaves, numpresent, maxbitlen - 1, i);

      for(node = lists.chains1[maxbitlen - 1]; node; node = node->tail)
      {
        for(i = 0; i != node->index; ++i) ++lengths[leaves[i].index];
      }
    }

    lodepng_free(lists.memory);
    lodepng_free(lists.freelist);
    lodepng_free(lists.chains0);
    lodepng_free(lists.chains1);
  }

  lodepng_free(leaves);
  return error;
}